

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O1

int mbedtls_chachapoly_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  uchar mac [16];
  mbedtls_chachapoly_context ctx;
  uchar output [200];
  
  if (verbose != 0) {
    printf("  ChaCha20-Poly1305 test %u ",0);
  }
  mbedtls_chacha20_init(&ctx.chacha20_ctx);
  mbedtls_poly1305_init(&ctx.poly1305_ctx);
  ctx.aad_len = 0;
  ctx.ciphertext_len = 0;
  ctx.state = 0;
  ctx.mode = MBEDTLS_CHACHAPOLY_ENCRYPT;
  uVar1 = mbedtls_chacha20_setkey(&ctx.chacha20_ctx,test_key[0]);
  if (uVar1 == 0) {
    uVar1 = chachapoly_crypt_and_tag
                      (&ctx,MBEDTLS_CHACHAPOLY_ENCRYPT,0x72,test_nonce[0],test_aad[0],0xc,
                       test_input[0],output,mac);
    if (uVar1 == 0) {
      iVar2 = bcmp(output,test_output,0x72);
      if (iVar2 == 0) {
        auVar4[0] = -(mac[0] == '\x1a');
        auVar4[1] = -(mac[1] == 0xe1);
        auVar4[2] = -(mac[2] == '\v');
        auVar4[3] = -(mac[3] == 'Y');
        auVar4[4] = -(mac[4] == 'O');
        auVar4[5] = -(mac[5] == '\t');
        auVar4[6] = -(mac[6] == 0xe2);
        auVar4[7] = -(mac[7] == 'j');
        auVar4[8] = -(mac[8] == '~');
        auVar4[9] = -(mac[9] == 0x90);
        auVar4[10] = -(mac[10] == '.');
        auVar4[0xb] = -(mac[0xb] == 0xcb);
        auVar4[0xc] = -(mac[0xc] == 0xd0);
        auVar4[0xd] = -(mac[0xd] == '`');
        auVar4[0xe] = -(mac[0xe] == '\x06');
        auVar4[0xf] = -(mac[0xf] == 0x91);
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
          mbedtls_chacha20_free(&ctx.chacha20_ctx);
          mbedtls_poly1305_free(&ctx.poly1305_ctx);
          ctx.aad_len = 0;
          ctx.ciphertext_len = 0;
          ctx.state = 0;
          ctx.mode = MBEDTLS_CHACHAPOLY_ENCRYPT;
          if (verbose == 0) {
            return 0;
          }
          puts("passed");
          putchar(10);
          return 0;
        }
        if (verbose == 0) {
          return -1;
        }
        pcVar3 = "failure (wrong MAC)";
      }
      else {
        if (verbose == 0) {
          return -1;
        }
        pcVar3 = "failure (wrong output)";
      }
      puts(pcVar3);
      return -1;
    }
    if (verbose == 0) {
      return -1;
    }
    pcVar3 = "crypt_and_tag() error code: %i\n";
  }
  else {
    if (verbose == 0) {
      return -1;
    }
    pcVar3 = "setkey() error code: %i\n";
  }
  printf(pcVar3,(ulong)uVar1);
  return -1;
}

Assistant:

int mbedtls_chachapoly_self_test( int verbose )
{
    mbedtls_chachapoly_context ctx;
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output[200];
    unsigned char mac[16];

    for( i = 0U; i < 1U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ChaCha20-Poly1305 test %u ", i );

        mbedtls_chachapoly_init( &ctx );

        ret = mbedtls_chachapoly_setkey( &ctx, test_key[i] );
        ASSERT( 0 == ret, ( "setkey() error code: %i\n", ret ) );

        ret = mbedtls_chachapoly_encrypt_and_tag( &ctx,
                                                  test_input_len[i],
                                                  test_nonce[i],
                                                  test_aad[i],
                                                  test_aad_len[i],
                                                  test_input[i],
                                                  output,
                                                  mac );

        ASSERT( 0 == ret, ( "crypt_and_tag() error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( output, test_output[i], test_input_len[i] ),
                ( "failure (wrong output)\n" ) );

        ASSERT( 0 == memcmp( mac, test_mac[i], 16U ),
                ( "failure (wrong MAC)\n" ) );

        mbedtls_chachapoly_free( &ctx );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}